

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_c1a11d::LevelTest::SetUp(LevelTest *this)

{
  long in_RDI;
  TestMode in_stack_000000bc;
  EncoderTest *in_stack_000000c0;
  
  libaom_test::EncoderTest::InitializeConfig(in_stack_000000c0,in_stack_000000bc);
  if (*(int *)(in_RDI + 0x3f4) == 0) {
    *(undefined4 *)(in_RDI + 0xcc) = 1000;
    *(undefined4 *)(in_RDI + 0xd0) = 500;
    *(undefined4 *)(in_RDI + 0xd4) = 600;
  }
  else {
    *(undefined4 *)(in_RDI + 0x68) = 5;
  }
  return;
}

Assistant:

void SetUp() override {
    InitializeConfig(encoding_mode_);
    if (encoding_mode_ != ::libaom_test::kRealTime) {
      cfg_.g_lag_in_frames = 5;
    } else {
      cfg_.rc_buf_sz = 1000;
      cfg_.rc_buf_initial_sz = 500;
      cfg_.rc_buf_optimal_sz = 600;
    }
  }